

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O2

void __thiscall
poplar::
compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::update_slot_(compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
               *this,uint64_t slot_id,uint64_t quo,uint64_t dsp)

{
  if (6 < dsp) {
    if (dsp - 7 < 0x7f) {
      compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::set
                (&this->aux_cht_,slot_id,dsp - 7);
    }
    else {
      standard_hash_table<80U,_poplar::hash::vigna_hasher>::set(&this->aux_map_,slot_id,dsp);
    }
    dsp = 7;
  }
  compact_vector::set(&this->table_,slot_id,dsp + quo * 8);
  return;
}

Assistant:

void update_slot_(uint64_t slot_id, uint64_t quo, uint64_t dsp) {
        assert(table_[slot_id] == 0);
        assert(quo < symb_size_.size());

        uint64_t v = quo << dsp1_bits;

        if (dsp < dsp1_mask) {
            v |= dsp;
        } else {
            v |= dsp1_mask;
            uint64_t _dsp = dsp - dsp1_mask;
            if (_dsp < dsp2_mask) {
                aux_cht_.set(slot_id, _dsp);
            } else {
                aux_map_.set(slot_id, dsp);
            }
        }

#ifdef POPLAR_EXTRA_STATS
        if (dsp < dsp1_mask) {
            ++num_dsps_[0];
        } else if (dsp < dsp1_mask + dsp2_mask) {
            ++num_dsps_[1];
        } else {
            ++num_dsps_[2];
        }
#endif

        table_.set(slot_id, v);
    }